

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O2

int _lws_change_pollfd(lws *wsi,int _and,int _or,lws_pollargs *pa)

{
  uint uVar1;
  lws_context *context;
  lws_foreign_thread_pollfd *plVar2;
  pollfd *ppVar3;
  _func_void_lws_ptr_int *p_Var4;
  int iVar5;
  int iVar6;
  lws_foreign_thread_pollfd *plVar7;
  long lVar8;
  long lVar9;
  lws_foreign_thread_pollfd *plVar10;
  char *__assertion;
  ushort uVar11;
  
  iVar5 = 0;
  if (wsi == (lws *)0x0) {
    return 0;
  }
  iVar6 = wsi->position_in_fds_table;
  if (-2 < iVar6) {
    if (iVar6 != -1) {
      if (((_or == 4) && (_and == 0)) && (wsi->handling_pollout != '\0')) {
        wsi->leave_pollout_active = '\x01';
        iVar5 = 0;
        _lws_log(0x10,"%s: using leave_pollout_active\n","_lws_change_pollfd");
      }
      else {
        context = wsi->context;
        lVar8 = (long)wsi->tsi;
        lVar9 = lVar8 * 0x188;
        if (*(int *)((long)&context->set + lVar9 + -0x50) <= iVar6) {
          __assertion = "wsi->position_in_fds_table < (int)pt->fds_count";
          uVar1 = 0x49;
          goto LAB_00113ef3;
        }
        *(undefined1 *)((long)&context->set + lVar9 + -0x43) = 1;
        if (*(char *)((long)&context->set + lVar9 + -0x44) == '\0') {
          *(undefined1 *)((long)&context->set + lVar9 + -0x43) = 0;
          ppVar3 = context->pt[lVar8].fds;
          iVar5 = wsi->position_in_fds_table;
          uVar1 = (wsi->desc).sockfd;
          pa->fd = uVar1;
          _lws_log(0x10,"%s: wsi %p: fd %d events %d -> %d\n","_lws_change_pollfd",wsi,(ulong)uVar1,
                   (ulong)(uint)(int)ppVar3[iVar5].events,(int)ppVar3[iVar5].events & ~_and | _or);
          uVar11 = ppVar3[iVar5].events;
          pa->prev_events = (int)(short)uVar11;
          uVar11 = (ushort)~_and & uVar11 | (ushort)_or;
          ppVar3[iVar5].events = uVar11;
          pa->events = (int)(short)uVar11;
          if ((wsi->field_0x2dc & 2) != 0) {
            return 0;
          }
          p_Var4 = context->event_loop_ops->io;
          if (p_Var4 != (_func_void_lws_ptr_int *)0x0) {
            if ((_and & 1U) != 0) {
              (*p_Var4)(wsi,9);
            }
            if ((_or & 1U) != 0) {
              (*context->event_loop_ops->io)(wsi,5);
            }
            if ((_and & 4U) != 0) {
              (*context->event_loop_ops->io)(wsi,10);
            }
            if ((_or & 4U) != 0) {
              (*context->event_loop_ops->io)(wsi,6);
            }
          }
          if (pa->prev_events == pa->events) {
            return 0;
          }
          iVar5 = lws_plat_change_pollfd(context,wsi,ppVar3 + iVar5);
          if (iVar5 == 0) {
            iVar5 = *(int *)((long)&context->set + lVar9 + -0x4c);
            if (iVar5 == 0) {
              return 0;
            }
            if (wsi->vhost == (lws_vhost *)0x0) {
              return 0;
            }
            iVar6 = (*wsi->vhost->protocols->callback)
                              (wsi,LWS_CALLBACK_GET_THREAD_ID,(void *)0x0,(void *)0x0,0);
            if (iVar6 != -1) {
              if (iVar6 == iVar5) {
                return 0;
              }
              lws_cancel_service_pt(wsi);
              return 0;
            }
          }
          else {
            _lws_log(8,"%s failed\n","_lws_change_pollfd");
          }
        }
        else {
          plVar7 = (lws_foreign_thread_pollfd *)lws_realloc((void *)0x0,0x18,"ftp");
          if (plVar7 != (lws_foreign_thread_pollfd *)0x0) {
            plVar7->_and = _and;
            plVar7->_or = _or;
            plVar7->fd_index = wsi->position_in_fds_table;
            plVar7->next = (lws_foreign_thread_pollfd *)0x0;
            plVar2 = (lws_foreign_thread_pollfd *)&context->pt[lVar8].foreign_pfd_list;
            do {
              plVar10 = plVar2;
              plVar2 = plVar10->next;
            } while (plVar2 != (lws_foreign_thread_pollfd *)0x0);
            plVar10->next = plVar7;
            *(undefined1 *)((long)&context->set + lVar9 + -0x43) = 0;
            lws_cancel_service_pt(wsi);
            return 0;
          }
          *(undefined1 *)((long)&context->set + lVar9 + -0x43) = 0;
        }
        iVar5 = -1;
      }
    }
    return iVar5;
  }
  __assertion = "wsi->position_in_fds_table == LWS_NO_FDS_POS || wsi->position_in_fds_table >= 0";
  uVar1 = 0x2c;
LAB_00113ef3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/pollfd.c"
                ,uVar1,"int _lws_change_pollfd(struct lws *, int, int, struct lws_pollargs *)");
}

Assistant:

int
__lws_change_pollfd(struct lws *wsi, int _and, int _or)
{
	struct lws_context *context;
	struct lws_pollargs pa;
	int ret = 0;

	if (!wsi || (!wsi->protocol && !wsi->event_pipe) ||
	    wsi->position_in_fds_table == LWS_NO_FDS_POS)
		return 0;

	context = lws_get_context(wsi);
	if (!context)
		return 1;

#if defined(LWS_WITH_EXTERNAL_POLL)
	if (wsi->vhost &&
	    wsi->vhost->protocols[0].callback(wsi, LWS_CALLBACK_LOCK_POLL,
					      wsi->user_space, (void *) &pa, 0))
		return -1;
#endif

	ret = _lws_change_pollfd(wsi, _and, _or, &pa);

#if defined(LWS_WITH_EXTERNAL_POLL)
	if (wsi->vhost &&
	    wsi->vhost->protocols[0].callback(wsi, LWS_CALLBACK_UNLOCK_POLL,
					   wsi->user_space, (void *) &pa, 0))
		ret = -1;
#endif

	return ret;
}